

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_map.h
# Opt level: O0

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
::try_emplace_impl<char_const(&)[5]>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
          *this,char (*k) [5])

{
  iterator iter;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>::iterator,_bool>
  *res;
  tuple<const_char_(&)[5]> local_30;
  ctrl_t *local_28;
  anon_union_8_1_a8a14541_for_iterator_2 local_20;
  char (*local_18) [5];
  char (*k_local) [5];
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
  *this_local;
  
  local_18 = k;
  k_local = (char (*) [5])this;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
  ::find_or_prepare_insert<char[5]>
            (__return_storage_ptr__,
             (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::FieldDescriptorProto_Type>_>_>
              *)this,k);
  if ((__return_storage_ptr__->second & 1U) != 0) {
    local_28 = (__return_storage_ptr__->first).ctrl_;
    local_20 = (anon_union_8_1_a8a14541_for_iterator_2)(__return_storage_ptr__->first).field_1.slot_
    ;
    std::forward_as_tuple<char_const(&)[5]>((char (*) [5])&local_30);
    std::forward_as_tuple<>();
    iter.field_1 = (anon_union_8_1_a8a14541_for_iterator_2)
                   (anon_union_8_1_a8a14541_for_iterator_2)local_20.slot_;
    iter.ctrl_ = local_28;
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
    ::emplace_at<std::piecewise_construct_t_const&,std::tuple<char_const(&)[5]>,std::tuple<>>
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,google::protobuf::FieldDescriptorProto_Type>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,google::protobuf::FieldDescriptorProto_Type>>>
                *)this,iter,(piecewise_construct_t *)&std::piecewise_construct,&local_30,
               (tuple<> *)((long)&res + 7));
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> try_emplace_impl(K&& k, Args&&... args)
      ABSL_ATTRIBUTE_LIFETIME_BOUND {
    auto res = this->find_or_prepare_insert(k);
    if (res.second) {
      this->emplace_at(res.first, std::piecewise_construct,
                       std::forward_as_tuple(std::forward<K>(k)),
                       std::forward_as_tuple(std::forward<Args>(args)...));
    }
    return res;
  }